

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O2

bool __thiscall
cppcms::anon_unknown_0::
base_handler<std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
::dispatch(base_handler<std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
           *this,string *url,char *method,application *param_3)

{
  cmatch *this_00;
  bool bVar1;
  string_type sStack_138;
  string_type local_118;
  string_type local_f8;
  string_type local_d8;
  string_type local_b8;
  value_type local_98;
  value_type local_80;
  value_type local_68;
  value_type local_50;
  value_type local_38;
  
  bVar1 = option::matches(&this->super_option,url,method);
  if (bVar1) {
    this_00 = &(this->super_option).match_;
    booster::match_results<const_char_*>::operator[](&local_38,this_00,this->select_[0]);
    booster::sub_match<char_const*>::str_abi_cxx11_(&local_b8,&local_38);
    booster::match_results<const_char_*>::operator[](&local_50,this_00,this->select_[1]);
    booster::sub_match<char_const*>::str_abi_cxx11_(&local_d8,&local_50);
    booster::match_results<const_char_*>::operator[](&local_68,this_00,this->select_[2]);
    booster::sub_match<char_const*>::str_abi_cxx11_(&local_f8,&local_68);
    booster::match_results<const_char_*>::operator[](&local_80,this_00,this->select_[3]);
    booster::sub_match<char_const*>::str_abi_cxx11_(&local_118,&local_80);
    booster::match_results<const_char_*>::operator[](&local_98,this_00,this->select_[4]);
    booster::sub_match<char_const*>::str_abi_cxx11_(&sStack_138,&local_98);
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::operator()(&this->handle_,&local_b8,&local_d8,&local_f8,&local_118,&sStack_138);
    std::__cxx11::string::~string((string *)&sStack_138);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  return bVar1;
}

Assistant:

virtual bool dispatch(std::string const &url,char const *method,application *)
			{
				if(matches(url,method)) {
					execute_handler(handle_);
					return true;
				}
				return false;
			}